

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

int __thiscall despot::EvalLog::GetNumCompletedRuns(EvalLog *this)

{
  pointer piVar1;
  int iVar2;
  int i;
  long lVar3;
  
  piVar1 = (this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = 0;
  for (lVar3 = 0;
      (long)(this->num_of_completed_runs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)piVar1 >> 2 != lVar3; lVar3 = lVar3 + 1) {
    iVar2 = iVar2 + piVar1[lVar3];
  }
  return iVar2;
}

Assistant:

int EvalLog::GetNumCompletedRuns() const {
	int num = 0;
	for (int i = 0; i < num_of_completed_runs.size(); i++)
		num += num_of_completed_runs[i];
	return num;
}